

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O1

void free_kd_tree(kd_tree_t *tree)

{
  uint uVar1;
  int iVar2;
  
  if (tree != (kd_tree_t *)0x0) {
    if (tree->n_level != 0) {
      uVar1 = ~(-1 << ((byte)tree->n_level & 0x1f));
      iVar2 = uVar1 + (uVar1 == 0);
      do {
        ckd_free(tree->nodes[uVar1].bbi);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    ckd_free(tree->nodes);
    ckd_free(tree);
    return;
  }
  return;
}

Assistant:

void
free_kd_tree(kd_tree_t * tree)
{
    uint32 i, n;

    if (tree == NULL)
        return;
    /* Balanced binary trees, so we have 2^level-1 nodes. */
    n = (1 << tree->n_level) - 1;
    for (i = 0; i < n; ++i)
        ckd_free(tree->nodes[n].bbi);
    ckd_free(tree->nodes);
    ckd_free(tree);
}